

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O0

bool __thiscall IceCore::Container::Resize(Container *this,udword needed)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  udword *__dest;
  udword local_44;
  udword *NewEntries;
  udword needed_local;
  Container *this_local;
  
  mUsedRam = mUsedRam + this->mMaxNbEntries * -4;
  if (this->mMaxNbEntries == 0) {
    local_44 = 2;
  }
  else {
    local_44 = (udword)(long)((float)this->mMaxNbEntries * this->mGrowthFactor);
  }
  this->mMaxNbEntries = local_44;
  if (this->mMaxNbEntries < this->mCurNbEntries + needed) {
    this->mMaxNbEntries = this->mCurNbEntries + needed;
  }
  auVar1 = ZEXT416(this->mMaxNbEntries) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __dest = (udword *)operator_new__(uVar2);
  if (__dest == (udword *)0x0) {
    this_local._3_1_ = false;
  }
  else {
    mUsedRam = mUsedRam + this->mMaxNbEntries * 4;
    if (this->mCurNbEntries != 0) {
      memcpy(__dest,this->mEntries,(ulong)(this->mCurNbEntries << 2));
    }
    if (this->mEntries != (udword *)0x0) {
      if (this->mEntries != (udword *)0x0) {
        operator_delete__(this->mEntries);
      }
      this->mEntries = (udword *)0x0;
    }
    this->mEntries = __dest;
    this_local._3_1_ = true;
  }
  return this_local._3_1_;
}

Assistant:

bool Container::Resize(udword needed)
{
#ifdef CONTAINER_STATS
	// Subtract previous amount of bytes
	mUsedRam-=mMaxNbEntries*sizeof(udword);
#endif

	// Get more entries
	mMaxNbEntries = mMaxNbEntries ? udword(float(mMaxNbEntries)*mGrowthFactor) : 2;	// Default nb Entries = 2
	if(mMaxNbEntries<mCurNbEntries + needed)	mMaxNbEntries = mCurNbEntries + needed;

	// Get some bytes for new entries
	udword*	NewEntries = new udword[mMaxNbEntries];
	CHECKALLOC(NewEntries);

#ifdef CONTAINER_STATS
	// Add current amount of bytes
	mUsedRam+=mMaxNbEntries*sizeof(udword);
#endif

	// Copy old data if needed
	if(mCurNbEntries)	CopyMemory(NewEntries, mEntries, mCurNbEntries*sizeof(udword));

	// Delete old data
	DELETEARRAY(mEntries);

	// Assign new pointer
	mEntries = NewEntries;

	return true;
}